

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

int nni_url_asprintf(char **str,nng_url *url)

{
  int iVar1;
  char *str_00;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = nng_url_sprintf((char *)0x0,0,url);
  str_00 = (char *)nni_alloc((long)(iVar1 + 1));
  if (str_00 == (char *)0x0) {
    iVar2 = 2;
  }
  else {
    nng_url_sprintf(str_00,(long)(iVar1 + 1),url);
    *str = str_00;
  }
  return iVar2;
}

Assistant:

int
nni_url_asprintf(char **str, const nng_url *url)
{
	char  *result;
	size_t sz;

	sz = nng_url_sprintf(NULL, 0, url) + 1;
	if ((result = nni_alloc(sz)) == NULL) {
		return (NNG_ENOMEM);
	}
	nng_url_sprintf(result, sz, url);
	*str = result;
	return (0);
}